

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::computeFtest(SPxSolverBase<double> *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  Verbosity VVar4;
  double *pdVar5;
  int *piVar6;
  streamsize sVar7;
  SPxOut *_spxout;
  SPxOut *_spxout_00;
  long in_RDI;
  streamsize prec;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  int i;
  int sparsitythreshold;
  double theeps;
  SPxSolverBase<double> *in_stack_ffffffffffffff58;
  SPxOut *in_stack_ffffffffffffff60;
  double local_68;
  undefined4 local_28;
  Verbosity local_24 [3];
  int local_18;
  int local_14;
  double local_10;
  
  local_10 = entertol(in_stack_ffffffffffffff58);
  *(undefined1 *)(in_RDI + 0x358) = 1;
  *(undefined1 *)(in_RDI + 0x368) = 1;
  *(undefined8 *)(in_RDI + 0x350) = 0;
  *(undefined8 *)(in_RDI + 0x360) = 0;
  *(undefined4 *)(in_RDI + 0x36c) = 0;
  IdxSet::clear((IdxSet *)(in_RDI + 0x7e8));
  dVar1 = *(double *)(in_RDI + 0x420);
  iVar2 = dim((SPxSolverBase<double> *)0x27cd81);
  local_14 = (int)(dVar1 * (double)iVar2);
  for (local_18 = 0; iVar2 = local_18, iVar3 = dim((SPxSolverBase<double> *)0x27cdba), iVar2 < iVar3
      ; local_18 = local_18 + 1) {
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff60,
                        (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    dVar1 = *pdVar5;
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff60,
                        (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    iVar2 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    if (dVar1 < *pdVar5 || dVar1 == *pdVar5) {
      pdVar5 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_ffffffffffffff60,iVar2)
      ;
      local_68 = *pdVar5;
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff60,
                          (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      local_68 = local_68 - *pdVar5;
    }
    else {
      pdVar5 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_ffffffffffffff60,iVar2)
      ;
      local_68 = *pdVar5;
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff60,
                          (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      local_68 = local_68 - *pdVar5;
    }
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff60,
                        (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    *pdVar5 = local_68;
    iVar2 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    if (*(int *)(in_RDI + 0x8a0) == 0) {
      pdVar5 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_ffffffffffffff60,iVar2)
      ;
      if (-local_10 <= *pdVar5) {
        piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x868),local_18);
        *piVar6 = 0;
      }
      else {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff60,
                            (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        *(double *)(in_RDI + 0x350) = *(double *)(in_RDI + 0x350) - *pdVar5;
        DIdxSet::addIdx((DIdxSet *)in_stack_ffffffffffffff60,
                        (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x868),local_18);
        *piVar6 = 1;
        *(int *)(in_RDI + 0x36c) = *(int *)(in_RDI + 0x36c) + 1;
      }
      iVar2 = IdxSet::size((IdxSet *)(in_RDI + 0x7e8));
      if (local_14 < iVar2) {
        if ((*(long *)(in_RDI + 0x918) != 0) &&
           (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x918)), 3 < (int)VVar4)) {
          local_24[2] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x918));
          local_24[1] = 4;
          (**(code **)(**(long **)(in_RDI + 0x918) + 0x10))(*(long **)(in_RDI + 0x918),local_24 + 1)
          ;
          soplex::operator<<(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
          soplex::operator<<(in_stack_ffffffffffffff60,
                             (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffff58);
          (**(code **)(**(long **)(in_RDI + 0x918) + 0x10))(*(long **)(in_RDI + 0x918),local_24 + 2)
          ;
        }
        *(undefined4 *)(in_RDI + 0x8a0) = 5;
        *(undefined1 *)(in_RDI + 0x898) = 0;
        IdxSet::clear((IdxSet *)(in_RDI + 0x7e8));
      }
    }
    else {
      pdVar5 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_ffffffffffffff60,iVar2)
      ;
      if (*pdVar5 < -local_10) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff60,
                            (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        *(double *)(in_RDI + 0x350) = *(double *)(in_RDI + 0x350) - *pdVar5;
        *(int *)(in_RDI + 0x36c) = *(int *)(in_RDI + 0x36c) + 1;
      }
    }
  }
  iVar2 = IdxSet::size((IdxSet *)(in_RDI + 0x7e8));
  if ((iVar2 == 0) && ((*(byte *)(in_RDI + 0x898) & 1) == 0)) {
    *(int *)(in_RDI + 0x8a0) = *(int *)(in_RDI + 0x8a0) + -1;
  }
  else {
    iVar2 = IdxSet::size((IdxSet *)(in_RDI + 0x7e8));
    if ((iVar2 <= local_14) && ((*(byte *)(in_RDI + 0x898) & 1) == 0)) {
      if ((*(long *)(in_RDI + 0x918) != 0) &&
         (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x918)), 3 < (int)VVar4)) {
        local_24[0] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x918));
        local_28 = 4;
        (**(code **)(**(long **)(in_RDI + 0x918) + 0x10))(*(long **)(in_RDI + 0x918),&local_28);
        sVar7 = SPxOut::precision((SPxOut *)0x27d256);
        if ((*(byte *)(in_RDI + 0x89b) & 1) == 0) {
          soplex::operator<<(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
        }
        else {
          soplex::operator<<(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
        }
        _spxout = soplex::operator<<(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
        std::setw(6);
        soplex::operator<<(_spxout,(_Setw)(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
        _spxout_00 = soplex::operator<<(in_stack_ffffffffffffff60,
                                        (_func_ios_base_ptr_ios_base_ptr *)_spxout);
        std::setprecision(4);
        soplex::operator<<(_spxout,(_Setprecision)(int)((ulong)_spxout_00 >> 0x20));
        dim((SPxSolverBase<double> *)0x27d322);
        soplex::operator<<(_spxout_00,(double)_spxout);
        soplex::operator<<(_spxout_00,(_func_ios_base_ptr_ios_base_ptr *)_spxout);
        std::setprecision((int)sVar7);
        soplex::operator<<(_spxout,(_Setprecision)(int)((ulong)_spxout_00 >> 0x20));
        soplex::operator<<(_spxout_00,(_func_ostream_ptr_ostream_ptr *)_spxout);
        (**(code **)(**(long **)(in_RDI + 0x918) + 0x10))(*(long **)(in_RDI + 0x918),local_24);
      }
      *(undefined1 *)(in_RDI + 0x898) = 1;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeFtest()
{

   assert(type() == LEAVE);

   R theeps = entertol();
   m_pricingViolUpToDate = true;
   m_pricingViolCoUpToDate = true;
   m_pricingViol = 0;
   m_pricingViolCo = 0;
   m_numViol = 0;
   infeasibilities.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * dim());

   for(int i = 0; i < dim(); ++i)
   {
      theCoTest[i] = ((*theFvec)[i] > theUBbound[i])
                     ? theUBbound[i] - (*theFvec)[i]
                     : (*theFvec)[i] - theLBbound[i];

      if(remainingRoundsLeave == 0)
      {
         if(theCoTest[i] < -theeps)
         {
            m_pricingViol -= theCoTest[i];
            infeasibilities.addIdx(i);
            isInfeasible[i] = SPxPricer<R>::VIOLATED;
            ++m_numViol;
         }
         else
            isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;

         if(infeasibilities.size() > sparsitythreshold)
         {
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                          << std::endl;)
            remainingRoundsLeave = SOPLEX_DENSEROUNDS;
            sparsePricingLeave = false;
            infeasibilities.clear();
         }
      }
      else if(theCoTest[i] < -theeps)
      {
         m_pricingViol -= theCoTest[i];
         m_numViol++;
      }
   }

   if(infeasibilities.size() == 0 && !sparsePricingLeave)
   {
      --remainingRoundsLeave;
   }
   else if(infeasibilities.size() <= sparsitythreshold && !sparsePricingLeave)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingLeave)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) m_numViol / dim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingLeave = true;
   }
}